

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_extensions.cpp
# Opt level: O3

spv_result_t
spvtools::val::anon_unknown_0::ValidateClspvReflectionPushConstantData
          (ValidationState_t *_,Instruction *inst)

{
  bool bVar1;
  uint uVar2;
  Op OVar3;
  long lVar4;
  char *pcVar5;
  DiagnosticStream DStack_1f8;
  
  uVar2 = Instruction::GetOperandAs<unsigned_int>(inst,4);
  bVar1 = IsUint32Constant(_,uVar2);
  if (bVar1) {
    uVar2 = Instruction::GetOperandAs<unsigned_int>(inst,5);
    bVar1 = IsUint32Constant(_,uVar2);
    if (bVar1) {
      uVar2 = Instruction::GetOperandAs<unsigned_int>(inst,6);
      OVar3 = ValidationState_t::GetIdOpcode(_,uVar2);
      if (OVar3 == OpString) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag(&DStack_1f8,_,SPV_ERROR_INVALID_ID,inst);
      pcVar5 = "Data must be an OpString";
      lVar4 = 0x18;
    }
    else {
      ValidationState_t::diag(&DStack_1f8,_,SPV_ERROR_INVALID_ID,inst);
      pcVar5 = "Size must be a 32-bit unsigned integer OpConstant";
      lVar4 = 0x31;
    }
  }
  else {
    ValidationState_t::diag(&DStack_1f8,_,SPV_ERROR_INVALID_ID,inst);
    pcVar5 = "Offset must be a 32-bit unsigned integer OpConstant";
    lVar4 = 0x33;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&DStack_1f8,pcVar5,lVar4);
  DiagnosticStream::~DiagnosticStream(&DStack_1f8);
  return DStack_1f8.error_;
}

Assistant:

spv_result_t ValidateClspvReflectionPushConstantData(ValidationState_t& _,
                                                     const Instruction* inst) {
  if (!IsUint32Constant(_, inst->GetOperandAs<uint32_t>(4))) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Offset must be a 32-bit unsigned integer OpConstant";
  }

  if (!IsUint32Constant(_, inst->GetOperandAs<uint32_t>(5))) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Size must be a 32-bit unsigned integer OpConstant";
  }

  if (_.GetIdOpcode(inst->GetOperandAs<uint32_t>(6)) != spv::Op::OpString) {
    return _.diag(SPV_ERROR_INVALID_ID, inst) << "Data must be an OpString";
  }

  return SPV_SUCCESS;
}